

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O3

void __thiscall
llvm::
DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
::moveFromOldBuckets
          (DenseMapBase<llvm::DenseMap<llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>,_llvm::StringRef,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::StringRef>,_llvm::detail::DenseSetPair<llvm::StringRef>_>
           *this,DenseSetPair<llvm::StringRef> *OldBucketsBegin,
          DenseSetPair<llvm::StringRef> *OldBucketsEnd)

{
  size_t sVar1;
  bool bVar2;
  DenseSetPair<llvm::StringRef> *in_RAX;
  DenseSetPair<llvm::StringRef> *ConstFoundBucket;
  DenseSetPair<llvm::StringRef> *local_28;
  
  local_28 = in_RAX;
  initEmpty(this);
  if (OldBucketsBegin != OldBucketsEnd) {
    do {
      bVar2 = DenseMapInfo<llvm::StringRef>::isEqual
                        (OldBucketsBegin->key,(StringRef)ZEXT816(0xffffffffffffffff));
      if ((!bVar2) &&
         (bVar2 = DenseMapInfo<llvm::StringRef>::isEqual
                            (OldBucketsBegin->key,(StringRef)ZEXT816(0xfffffffffffffffe)), !bVar2))
      {
        bVar2 = LookupBucketFor<llvm::StringRef>(this,&OldBucketsBegin->key,&local_28);
        if (bVar2) {
          __assert_fail("!FoundVal && \"Key already in new map?\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/DenseMap.h"
                        ,0x176,
                        "void llvm::DenseMapBase<llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>::moveFromOldBuckets(BucketT *, BucketT *) [DerivedT = llvm::DenseMap<llvm::StringRef, llvm::detail::DenseSetEmpty, llvm::DenseMapInfo<StringRef>, llvm::detail::DenseSetPair<llvm::StringRef>>, KeyT = llvm::StringRef, ValueT = llvm::detail::DenseSetEmpty, KeyInfoT = llvm::DenseMapInfo<StringRef>, BucketT = llvm::detail::DenseSetPair<llvm::StringRef>]"
                       );
        }
        sVar1 = (OldBucketsBegin->key).Length;
        (local_28->key).Data = (OldBucketsBegin->key).Data;
        (local_28->key).Length = sVar1;
        *(int *)(this + 8) = *(int *)(this + 8) + 1;
      }
      OldBucketsBegin = (DenseSetPair<llvm::StringRef> *)(&OldBucketsBegin->key + 1);
    } while (OldBucketsBegin != OldBucketsEnd);
  }
  return;
}

Assistant:

void moveFromOldBuckets(BucketT *OldBucketsBegin, BucketT *OldBucketsEnd) {
    initEmpty();

    // Insert all the old elements.
    const KeyT EmptyKey = getEmptyKey();
    const KeyT TombstoneKey = getTombstoneKey();
    for (BucketT *B = OldBucketsBegin, *E = OldBucketsEnd; B != E; ++B) {
      if (!KeyInfoT::isEqual(B->getFirst(), EmptyKey) &&
          !KeyInfoT::isEqual(B->getFirst(), TombstoneKey)) {
        // Insert the key/value into the new table.
        BucketT *DestBucket;
        bool FoundVal = LookupBucketFor(B->getFirst(), DestBucket);
        (void)FoundVal; // silence warning.
        assert(!FoundVal && "Key already in new map?");
        DestBucket->getFirst() = std::move(B->getFirst());
        ::new (&DestBucket->getSecond()) ValueT(std::move(B->getSecond()));
        incrementNumEntries();

        // Free the value.
        B->getSecond().~ValueT();
      }
      B->getFirst().~KeyT();
    }
  }